

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  size_t sVar2;
  void *pvVar3;
  Mat *this_00;
  uint uVar4;
  undefined1 auVar5 [12];
  int iVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pBVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  Yolov3DetectionOutput *this_01;
  pointer pMVar21;
  int i;
  int iVar22;
  ulong uVar23;
  float *pfVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar33;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_158;
  float *local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  float fStack_50;
  float fStack_4c;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar20 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar20) {
      this_01 = this;
      qsort_descent_inplace(this,&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
      nms_sorted_bboxes(this_01,&all_bbox_rects,&picked,this->nms_threshold);
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar20 = 0;
          uVar20 < (ulong)(CONCAT44(picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
                           CONCAT44(picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3);
          uVar20 = uVar20 + 1) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(long *)(CONCAT44(picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar20 * 8
                             ));
      }
      uVar20 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      iVar22 = (int)uVar20;
      if (iVar22 == 0) {
        iVar6 = 0;
      }
      else {
        this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(this_00,6,iVar22,4,opt->blob_allocator);
        pvVar3 = this_00->data;
        iVar6 = -100;
        if ((pvVar3 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar6 = 0;
          uVar20 = uVar20 & 0xffffffff;
          if (iVar22 < 1) {
            uVar20 = 0;
          }
          pBVar10 = bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
            fVar25 = pBVar10->score;
            lVar18 = (long)this_00->w * uVar14 * this_00->elemsize;
            *(float *)((long)pvVar3 + lVar18) = (float)pBVar10->label + 1.0;
            *(float *)((long)pvVar3 + lVar18 + 4) = fVar25;
            *(float *)((long)pvVar3 + lVar18 + 8) = pBVar10->xmin;
            *(float *)((long)pvVar3 + lVar18 + 0xc) = pBVar10->ymin;
            *(float *)((long)pvVar3 + lVar18 + 0x10) = pBVar10->xmax;
            *(float *)((long)pvVar3 + lVar18 + 0x14) = pBVar10->ymax;
            pBVar10 = pBVar10 + 1;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003f5ced:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar6;
    }
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)&bbox_rects,(long)this->num_box);
    pMVar21 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    iVar22 = this->num_box;
    iVar6 = pMVar21[uVar20].c / iVar22;
    if (iVar6 != this->num_class + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)&bbox_rects);
      iVar6 = -1;
      goto LAB_003f5ced;
    }
    pMVar21 = pMVar21 + uVar20;
    lVar18 = (long)iVar22;
    uVar14._0_4_ = pMVar21->w;
    uVar14._4_4_ = pMVar21->h;
    auVar34._0_4_ = (float)(int)(undefined4)uVar14;
    auVar34._4_4_ = (float)(int)uVar14._4_4_;
    fVar25 = *(float *)((long)(this->anchors_scale).data + uVar20 * 4);
    uVar19 = uVar14 & 0xffffffff;
    if ((int)(undefined4)uVar14 < 1) {
      uVar19 = 0;
    }
    uVar4 = uVar14._4_4_;
    if ((int)uVar14._4_4_ < 1) {
      uVar4 = 0;
    }
    auVar31._0_4_ = (float)(int)(fVar25 * auVar34._0_4_);
    auVar31._4_4_ = (float)(int)(fVar25 * auVar34._4_4_);
    auVar31._8_4_ = (float)(int)(fVar25 * 0.0);
    auVar31._12_4_ = (float)(int)(fVar25 * 0.0);
    auVar34._8_8_ = 0x3f0000003f000000;
    auVar32 = rcpps(auVar31,auVar34);
    fVar25 = auVar32._0_4_;
    fVar33 = auVar32._4_4_;
    for (lVar11 = 0; lVar11 < iVar22; lVar11 = lVar11 + 1) {
      lVar15 = lVar11 * iVar6;
      sVar2 = pMVar21->cstep;
      pvVar3 = pMVar21->data;
      uVar14 = pMVar21->elemsize;
      lVar12 = (long)pMVar21->w * uVar14;
      uVar23 = (long)pMVar21->d * (long)pMVar21->h * lVar12 + 0xfU & 0xfffffffffffffff0;
      uVar1 = *(undefined8 *)
               ((long)(this->biases).data +
               (long)((int)*(float *)((long)(this->mask).data + lVar11 * 4 + lVar18 * uVar20 * 4) *
                     2) * 4);
      local_150 = (float *)(sVar2 * lVar15 * uVar14 + (long)pvVar3);
      local_158 = (float *)((lVar15 + 1) * sVar2 * uVar14 + (long)pvVar3);
      pfVar16 = (float *)((lVar15 + 2) * sVar2 * uVar14 + (long)pvVar3);
      pfVar7 = (float *)((lVar15 + 3) * sVar2 * uVar14 + (long)pvVar3);
      pfVar24 = (float *)((lVar15 + 4) * sVar2 * uVar14 + (long)pvVar3);
      for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
        for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
          uVar13 = 0;
          uVar8 = (ulong)(uint)this->num_class;
          if (this->num_class < 1) {
            uVar8 = uVar13;
          }
          fVar27 = -3.4028235e+38;
          for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
            fVar26 = *(float *)((long)pvVar3 +
                               (uVar23 - uVar23 % uVar14) * uVar13 +
                               uVar17 * 4 + lVar12 * uVar9 + (lVar15 + 5) * sVar2 * uVar14);
            if (fVar27 <= fVar26) {
              fVar27 = fVar26;
            }
          }
          fVar26 = expf(-*pfVar24);
          fVar27 = expf(-fVar27);
          fVar27 = 1.0 / ((fVar27 + 1.0) * fVar26 + 1.0);
          if (this->confidence_threshold <= fVar27) {
            fVar26 = *local_158;
            auVar37 = ZEXT416((uint)fVar26);
            fVar28 = expf(-*local_150);
            fVar26 = expf(-fVar26);
            fVar29 = expf(*pfVar16);
            fVar30 = expf(*pfVar7);
            auVar32._4_4_ = fVar26 + 1.0;
            auVar32._0_4_ = fVar28 + 1.0;
            auVar32._8_4_ = extraout_XMM0_Db + 0.0;
            auVar32._12_4_ = extraout_XMM0_Db_00 + 0.0;
            auVar32 = rcpps(auVar37,auVar32);
            fStack_50 = (float)uVar1;
            fStack_4c = (float)((ulong)uVar1 >> 0x20);
            auVar36._0_4_ = auVar32._0_4_ * 1.0;
            auVar36._4_4_ = auVar32._4_4_ * 1.0;
            auVar36._8_4_ = fStack_50 * auVar32._8_4_;
            auVar36._12_4_ = fStack_4c * auVar32._12_4_;
            auVar5._4_8_ = auVar32._8_8_;
            auVar5._0_4_ = (float)(int)uVar9;
            auVar37._0_8_ = auVar5._0_8_ << 0x20;
            auVar37._8_4_ = auVar31._0_4_;
            auVar37._12_4_ = auVar31._4_4_;
            auVar35._4_12_ = auVar37._4_12_;
            auVar35._0_4_ = (float)(int)uVar17;
            auVar37 = rcpps(auVar36,auVar35);
            fVar38 = fVar29 * fStack_50 * auVar37._8_4_;
            fVar39 = fVar30 * fStack_4c * auVar37._12_4_;
            fVar38 = (fVar29 * fStack_50 - auVar31._0_4_ * fVar38) * auVar37._8_4_ + fVar38;
            fVar39 = (fVar30 * fStack_4c - auVar31._4_4_ * fVar39) * auVar37._12_4_ + fVar39;
            fVar28 = ((1.0 - (fVar28 + 1.0) * auVar36._0_4_) * auVar32._0_4_ + auVar36._0_4_ +
                     auVar35._0_4_) * ((1.0 - auVar34._0_4_ * fVar25) * fVar25 + fVar25);
            fVar26 = ((1.0 - (fVar26 + 1.0) * auVar36._4_4_) * auVar32._4_4_ + auVar36._4_4_ +
                     (float)(int)uVar9) * ((1.0 - auVar34._4_4_ * fVar33) * fVar33 + fVar33);
            fVar29 = fVar38 * 0.5;
            fVar30 = fVar39 * 0.5;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = fVar28 - fVar29;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = fVar26 - fVar30;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = fVar28 + fVar29;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = fVar26 + fVar30;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = fVar38 * fVar39;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = fVar27;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)(&(bbox_rects.
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              ._M_impl.super__Vector_impl_data._M_start)->score + lVar11 * 6),
                        (value_type *)&picked);
          }
          local_150 = local_150 + 1;
          local_158 = local_158 + 1;
          pfVar16 = pfVar16 + 1;
          pfVar7 = pfVar7 + 1;
          pfVar24 = pfVar24 + 1;
        }
      }
      iVar22 = this->num_box;
    }
    lVar18 = 8;
    for (lVar11 = 0; lVar11 < iVar22; lVar11 = lVar11 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8),
                 *(BBoxRect **)
                  ((long)&(bbox_rects.
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           ._M_impl.super__Vector_impl_data._M_start)->score + lVar18));
      iVar22 = this->num_box;
      lVar18 = lVar18 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)&bbox_rects);
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}